

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O1

void poly1305_donna::poly1305_init(poly1305_context *st,uchar *key)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  st->r[0] = *(uint *)key & 0x3ffffff;
  st->r[1] = *(uint *)(key + 3) >> 2 & 0x3ffff03;
  st->r[2] = *(uint *)(key + 6) >> 4 & 0x3ffc0ff;
  st->r[3] = *(uint *)(key + 9) >> 6 & 0x3f03fff;
  st->r[4] = *(uint *)(key + 0xc) >> 8 & 0xfffff;
  st->h[0] = 0;
  st->h[1] = 0;
  st->h[2] = 0;
  st->h[3] = 0;
  st->h[4] = 0;
  st->pad[0] = *(uint32_t *)(key + 0x10);
  st->pad[1] = *(uint32_t *)(key + 0x14);
  st->pad[2] = *(uint32_t *)(key + 0x18);
  st->pad[3] = *(uint32_t *)(key + 0x1c);
  st->leftover = 0;
  st->final = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void poly1305_init(poly1305_context *st, const unsigned char key[32]) noexcept {
    /* r &= 0xffffffc0ffffffc0ffffffc0fffffff */
    st->r[0] = (ReadLE32(&key[ 0])     ) & 0x3ffffff;
    st->r[1] = (ReadLE32(&key[ 3]) >> 2) & 0x3ffff03;
    st->r[2] = (ReadLE32(&key[ 6]) >> 4) & 0x3ffc0ff;
    st->r[3] = (ReadLE32(&key[ 9]) >> 6) & 0x3f03fff;
    st->r[4] = (ReadLE32(&key[12]) >> 8) & 0x00fffff;

    /* h = 0 */
    st->h[0] = 0;
    st->h[1] = 0;
    st->h[2] = 0;
    st->h[3] = 0;
    st->h[4] = 0;

    /* save pad for later */
    st->pad[0] = ReadLE32(&key[16]);
    st->pad[1] = ReadLE32(&key[20]);
    st->pad[2] = ReadLE32(&key[24]);
    st->pad[3] = ReadLE32(&key[28]);

    st->leftover = 0;
    st->final = 0;
}